

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::KcpTcpEventLoop::handleKcpMessage(KcpTcpEventLoop *this)

{
  KcpConnection *this_00;
  
  EventLoop::assertInLoopThread(&this->super_EventLoop);
  this_00 = (this->m_curKcpConn).
            super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (KcpConnection *)0x0) {
    __assert_fail("m_curKcpConn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                  ,0xee,"void sznet::net::KcpTcpEventLoop::handleKcpMessage()");
  }
  if ((this->m_curTcpConn).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    if (this_00->m_state == kConnecting) {
      KcpConnection::connectEstablished(this_00);
      this_00 = (this->m_curKcpConn).
                super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    KcpConnection::handleKcpMessage(this_00,&this->m_inputBuffer);
    return;
  }
  __assert_fail("m_curTcpConn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                ,0xef,"void sznet::net::KcpTcpEventLoop::handleKcpMessage()");
}

Assistant:

void KcpTcpEventLoop::handleKcpMessage()
{
	assertInLoopThread();
	assert(m_curKcpConn);
	assert(m_curTcpConn);
	if (m_curKcpConn->connecting())
	{
		// 说明第一哦
		m_curKcpConn->connectEstablished();
	}
	m_curKcpConn->handleKcpMessage(m_inputBuffer);
}